

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t,_so_5::disp::prio_one_thread::quoted_round_robin::disp_params_t>
::modify_disp_params
          (proxy_dispatcher_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t,_so_5::disp::prio_one_thread::quoted_round_robin::disp_params_t>
           *this,environment_t *env)

{
  bool bVar1;
  queue_params_t *pqVar2;
  lock_factory_t *__x;
  queue_params_t local_a8;
  lock_factory_t local_88;
  undefined1 local_58 [8];
  queue_params_t queue_params;
  lock_factory_t lf;
  environment_t *env_local;
  proxy_dispatcher_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::actual_disp_iface_t,_so_5::disp::prio_one_thread::quoted_round_robin::disp_params_t>
  *this_local;
  
  pqVar2 = prio_one_thread::quoted_round_robin::disp_params_t::queue_params(&this->m_disp_params);
  __x = mpsc_queue_traits::queue_params_t::lock_factory(pqVar2);
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::function((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
              *)&queue_params.m_lock_factory._M_invoker,__x);
  bVar1 = std::function::operator_cast_to_bool((function *)&queue_params.m_lock_factory._M_invoker);
  if (!bVar1) {
    pqVar2 = prio_one_thread::quoted_round_robin::disp_params_t::queue_params(&this->m_disp_params);
    mpsc_queue_traits::queue_params_t::queue_params_t((queue_params_t *)local_58,pqVar2);
    so_5::impl::default_lock_factory
              (&local_88,env,(lock_factory_t *)&queue_params.m_lock_factory._M_invoker);
    mpsc_queue_traits::queue_params_t::lock_factory((queue_params_t *)local_58,&local_88);
    std::
    function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
    ::~function(&local_88);
    mpsc_queue_traits::queue_params_t::queue_params_t(&local_a8,(queue_params_t *)local_58);
    prio_one_thread::quoted_round_robin::disp_params_t::set_queue_params
              (&this->m_disp_params,&local_a8);
    mpsc_queue_traits::queue_params_t::~queue_params_t(&local_a8);
    mpsc_queue_traits::queue_params_t::~queue_params_t((queue_params_t *)local_58);
  }
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::~function((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
               *)&queue_params.m_lock_factory._M_invoker);
  return;
}

Assistant:

void
		modify_disp_params( so_5::environment_t & env )
			{
				auto lf = m_disp_params.queue_params().lock_factory();
				if( !lf )
				{
					auto queue_params = m_disp_params.queue_params();
					queue_params.lock_factory(
							so_5::impl::default_lock_factory( env, lf ) );
					m_disp_params.set_queue_params( std::move(queue_params) );
				}
			}